

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cpp
# Opt level: O3

int __thiscall
Bind::mount(Bind *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,void *__data)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  char cVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  error_category *peVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ContextManager *pCVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  path *ppVar11;
  path *ppVar12;
  error_code error;
  path local_b0;
  error_code local_88;
  path *local_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  set_paths(this,(path *)__special_file,(path *)__dir);
  uVar4 = this->flags_;
  uVar6 = (ulong)(uVar4 & 1) ^ 0x5001;
  uVar8 = uVar6 + 4;
  if ((uVar4 & 2) != 0) {
    uVar8 = uVar6;
  }
  uVar6 = uVar8 + 2 + (ulong)(uVar4 & 4) * 2;
  if ((uVar4 & 8) != 0) {
    uVar6 = uVar8 + (ulong)(uVar4 & 4) * 2;
  }
  local_88._M_value = 0;
  peVar7 = (error_category *)std::_V2::system_category();
  ppVar11 = &this->from_;
  local_88._M_cat = peVar7;
  uVar8 = std::filesystem::status(ppVar11,&local_88);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(uVar8 & 0xff);
  if (paVar9 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
LAB_0011c550:
    if ((uVar4 & 0x10) != 0) goto LAB_0011c958;
    pCVar10 = ContextManager::get();
    format_abi_cxx11_(&local_b0._M_pathname,"%s not exists",(ppVar11->_M_pathname)._M_dataplus._M_p)
    ;
    (**pCVar10->_vptr_ContextManager)(pCVar10,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
      operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                      local_b0._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_88._M_value = 0;
    local_88._M_cat = peVar7;
    if ((int)paVar9 == 0xff) goto LAB_0011c550;
  }
  cVar3 = std::filesystem::status(ppVar11,&local_88);
  if (cVar3 == '\x02') {
    ppVar12 = &this->to_;
    std::filesystem::create_directories(ppVar12,&local_88);
    if (local_88._M_value != 0) {
      local_78 = ppVar11;
      pCVar10 = ContextManager::get();
      pcVar1 = (ppVar12->_M_pathname)._M_dataplus._M_p;
      (**(code **)(*(long *)local_88._M_cat + 0x20))(&local_70,local_88._M_cat,local_88._M_value);
      format_abi_cxx11_(&local_b0._M_pathname,"Cannot create dir %s for mount point: %s",pcVar1,
                        local_70._M_dataplus._M_p);
      (**pCVar10->_vptr_ContextManager)(pCVar10,&local_b0);
      ppVar11 = local_78;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
        operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                        local_b0._M_pathname.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    uVar4 = ::mount((ppVar11->_M_pathname)._M_dataplus._M_p,(ppVar12->_M_pathname)._M_dataplus._M_p,
                    "none",uVar6,"");
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar4;
    if ((int)uVar4 < 0) {
      pCVar10 = ContextManager::get();
      format_abi_cxx11_(&local_b0._M_pathname,"Cannot mount %s: %m",
                        (ppVar12->_M_pathname)._M_dataplus._M_p);
      (**pCVar10->_vptr_ContextManager)(pCVar10,&local_b0);
LAB_0011c8b2:
      paVar9 = &local_b0._M_pathname.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_pathname._M_dataplus._M_p != paVar9) {
        operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                        local_b0._M_pathname.field_2._M_allocated_capacity + 1);
        paVar9 = extraout_RAX;
      }
    }
LAB_0011c8cd:
    this->mounted_ = true;
  }
  else {
    cVar3 = std::filesystem::status(ppVar11,&local_88);
    if (cVar3 == '\x01') {
      ppVar12 = &this->to_;
      std::filesystem::__cxx11::path::parent_path();
      std::filesystem::create_directories(&local_b0,&local_88);
      std::filesystem::__cxx11::path::~path(&local_b0);
      if (local_88._M_value != 0) {
        local_78 = ppVar12;
        pCVar10 = ContextManager::get();
        std::filesystem::__cxx11::path::parent_path();
        _Var2._M_p = local_b0._M_pathname._M_dataplus._M_p;
        (**(code **)(*(long *)local_88._M_cat + 0x20))(local_50,local_88._M_cat,local_88._M_value);
        format_abi_cxx11_(&local_70,"Cannot create dir %s: %s",_Var2._M_p,local_50[0]);
        (**pCVar10->_vptr_ContextManager)(pCVar10,&local_70);
        ppVar12 = local_78;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        std::filesystem::__cxx11::path::~path(&local_b0);
      }
      iVar5 = open((ppVar12->_M_pathname)._M_dataplus._M_p,0x241);
      if (iVar5 < 0) {
        pCVar10 = ContextManager::get();
        format_abi_cxx11_(&local_b0._M_pathname,"Cannot create file %s for mount point: %m",
                          (ppVar12->_M_pathname)._M_dataplus._M_p);
        (**pCVar10->_vptr_ContextManager)(pCVar10,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
          operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                          local_b0._M_pathname.field_2._M_allocated_capacity + 1);
        }
      }
      iVar5 = close(iVar5);
      if (iVar5 < 0) {
        pCVar10 = ContextManager::get();
        format_abi_cxx11_(&local_b0._M_pathname,"Cannot close file desctiptor: %m");
        (**pCVar10->_vptr_ContextManager)(pCVar10,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
          operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                          local_b0._M_pathname.field_2._M_allocated_capacity + 1);
        }
      }
      uVar4 = ::mount((ppVar11->_M_pathname)._M_dataplus._M_p,
                      (ppVar12->_M_pathname)._M_dataplus._M_p,"none",uVar6,"");
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(ulong)uVar4;
      if ((int)uVar4 < 0) {
        pCVar10 = ContextManager::get();
        format_abi_cxx11_(&local_b0._M_pathname,"Cannot mount %s: %m",
                          (ppVar12->_M_pathname)._M_dataplus._M_p);
        (**pCVar10->_vptr_ContextManager)(pCVar10,&local_b0);
        goto LAB_0011c8b2;
      }
      goto LAB_0011c8cd;
    }
    pCVar10 = ContextManager::get();
    format_abi_cxx11_(&local_b0._M_pathname,"%s is not directory nor regular file",
                      (this->to_)._M_pathname._M_dataplus._M_p);
    (**pCVar10->_vptr_ContextManager)(pCVar10,&local_b0);
    paVar9 = &local_b0._M_pathname.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_pathname._M_dataplus._M_p != paVar9) {
      operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                      local_b0._M_pathname.field_2._M_allocated_capacity + 1);
      paVar9 = extraout_RAX_01;
    }
  }
  if (local_88._M_value != 0) {
    pCVar10 = ContextManager::get();
    pcVar1 = (ppVar11->_M_pathname)._M_dataplus._M_p;
    (**(code **)(*(long *)local_88._M_cat + 0x20))(&local_70,local_88._M_cat,local_88._M_value);
    format_abi_cxx11_(&local_b0._M_pathname,"Cannot stat %s: %s",pcVar1,local_70._M_dataplus._M_p);
    (**pCVar10->_vptr_ContextManager)(pCVar10,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
      operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                      local_b0._M_pathname.field_2._M_allocated_capacity + 1);
    }
    paVar9 = &local_70.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar9) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      paVar9 = extraout_RAX_00;
    }
  }
LAB_0011c958:
  return (int)paVar9;
}

Assistant:

void Bind::mount(const fs::path &root_dir, const fs::path &work_dir) {
    set_paths(root_dir, work_dir);
    unsigned long mount_flags = (MS_BIND | MS_REC);
    if (!(flags_ & Rules::RW)) {
        mount_flags |= MS_RDONLY;
    }
    if (!(flags_ & Rules::DEV)) {
        mount_flags |= MS_NODEV;
    }
    if (flags_ & Rules::NOEXEC) {
        mount_flags |= MS_NOEXEC;
    }
    if (!(flags_ & Rules::SUID)) {
        mount_flags |= MS_NOSUID;
    }

    bool optional = (flags_ & Rules::OPT);

    std::error_code error;
    if (!fs::exists(from_, error)) {
        if (optional) return;
        die(format("%s not exists", from_.c_str()));
    }

    if (fs::is_directory(from_, error)) {
        fs::create_directories(to_, error);
        if (error) {
            die(format("Cannot create dir %s for mount point: %s", to_.c_str(), error.message().c_str()));
        }
        if (::mount(from_.c_str(), to_.c_str(), "none", mount_flags, "") < 0) {
            die(format("Cannot mount %s: %m", to_.c_str()));
        }
        mounted_ = true;
    } else if (fs::is_regular_file(from_, error)) {
        fs::create_directories(to_.parent_path(), error);
        if (error) {
            die(format("Cannot create dir %s: %s", from_.parent_path().c_str(), error.message().c_str()));
        }
        int fd = open(to_.c_str(), O_CREAT | O_WRONLY | O_TRUNC);
        if (fd < 0) {
            die(format("Cannot create file %s for mount point: %m", to_.c_str()));
        }
        if (close(fd) < 0) {
            die(format("Cannot close file desctiptor: %m"));
        }
        if (::mount(from_.c_str(), to_.c_str(), "none", mount_flags, "") < 0) {
            die(format("Cannot mount %s: %m", to_.c_str()));
        }
        mounted_ = true;
    } else {
        die(format("%s is not directory nor regular file", to_.c_str()));
    }
    if (error) {
        die(format("Cannot stat %s: %s", from_.c_str(), error.message().c_str()));
    }
}